

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  type_conflict5 tVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  int start_00;
  undefined4 in_register_00000014;
  uint uVar3;
  int iVar4;
  int iVar5;
  int size_00;
  undefined4 in_register_00000084;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  IdxElement *pIVar9;
  IdxElement *pIVar10;
  int local_844;
  IdxElement *local_840;
  IdxCompare *local_838;
  undefined8 local_830;
  long local_828;
  long local_820;
  ulong local_818;
  int local_80c;
  IdxElement *local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  ulong local_7f0;
  IdxElement pivotkey;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_764;
  IdxElement tmp;
  IdxElement local_660;
  IdxElement local_5dc;
  IdxElement local_558;
  IdxElement local_4d4;
  IdxElement local_450;
  IdxElement local_3cc;
  IdxElement local_348;
  IdxElement local_2c4;
  IdxElement local_240;
  IdxElement local_1bc;
  IdxElement local_138;
  IdxElement local_b4;
  
  local_830 = CONCAT44(in_register_00000084,size);
  local_7f8 = CONCAT44(in_register_00000014,start);
  local_800 = CONCAT44(in_register_0000000c,end);
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  uVar8 = (ulong)(uint)start2;
  if (start2 <= start) {
    uVar8 = (ulong)(uint)start;
  }
  iVar2 = (int)uVar8;
  local_80c = iVar2 + size;
  uVar3 = end - 1;
  local_838 = compare;
  if ((int)uVar3 <= local_80c) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,end,compare,iVar2,type);
    return uVar3;
  }
  pivotkey.val.m_backend.fpclass = cpp_dec_float_finite;
  pivotkey.val.m_backend.prec_elem = 0x1c;
  pivotkey.val.m_backend.data._M_elems[0] = 0;
  pivotkey.val.m_backend.data._M_elems[1] = 0;
  pivotkey.val.m_backend.data._M_elems[2] = 0;
  pivotkey.val.m_backend.data._M_elems[3] = 0;
  pivotkey.val.m_backend.data._M_elems[4] = 0;
  pivotkey.val.m_backend.data._M_elems[5] = 0;
  pivotkey.val.m_backend.data._M_elems[6] = 0;
  pivotkey.val.m_backend.data._M_elems[7] = 0;
  pivotkey.val.m_backend.data._M_elems[8] = 0;
  pivotkey.val.m_backend.data._M_elems[9] = 0;
  pivotkey.val.m_backend.data._M_elems[10] = 0;
  pivotkey.val.m_backend.data._M_elems[0xb] = 0;
  pivotkey.val.m_backend.data._M_elems[0xc] = 0;
  pivotkey.val.m_backend.data._M_elems[0xd] = 0;
  pivotkey.val.m_backend.data._M_elems[0xe] = 0;
  pivotkey.val.m_backend.data._M_elems[0xf] = 0;
  pivotkey.val.m_backend.data._M_elems[0x10] = 0;
  pivotkey.val.m_backend.data._M_elems[0x11] = 0;
  pivotkey.val.m_backend.data._M_elems[0x12] = 0;
  pivotkey.val.m_backend.data._M_elems[0x13] = 0;
  pivotkey.val.m_backend.data._M_elems[0x14] = 0;
  pivotkey.val.m_backend.data._M_elems[0x15] = 0;
  pivotkey.val.m_backend.data._M_elems[0x16] = 0;
  pivotkey.val.m_backend.data._M_elems[0x17] = 0;
  pivotkey.val.m_backend.data._M_elems[0x18] = 0;
  pivotkey.val.m_backend.data._M_elems[0x19] = 0;
  pivotkey.val.m_backend.data._M_elems._104_5_ = 0;
  pivotkey.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  pivotkey.val.m_backend.exp = 0;
  pivotkey.val.m_backend.neg = false;
  tmp.val.m_backend.fpclass = cpp_dec_float_finite;
  tmp.val.m_backend.prec_elem = 0x1c;
  tmp.val.m_backend.data._M_elems[0] = 0;
  tmp.val.m_backend.data._M_elems[1] = 0;
  tmp.val.m_backend.data._M_elems[2] = 0;
  tmp.val.m_backend.data._M_elems[3] = 0;
  tmp.val.m_backend.data._M_elems[4] = 0;
  tmp.val.m_backend.data._M_elems[5] = 0;
  tmp.val.m_backend.data._M_elems[6] = 0;
  tmp.val.m_backend.data._M_elems[7] = 0;
  tmp.val.m_backend.data._M_elems[8] = 0;
  tmp.val.m_backend.data._M_elems[9] = 0;
  tmp.val.m_backend.data._M_elems[10] = 0;
  tmp.val.m_backend.data._M_elems[0xb] = 0;
  tmp.val.m_backend.data._M_elems[0xc] = 0;
  tmp.val.m_backend.data._M_elems[0xd] = 0;
  tmp.val.m_backend.data._M_elems[0xe] = 0;
  tmp.val.m_backend.data._M_elems[0xf] = 0;
  tmp.val.m_backend.data._M_elems[0x10] = 0;
  tmp.val.m_backend.data._M_elems[0x11] = 0;
  tmp.val.m_backend.data._M_elems[0x12] = 0;
  tmp.val.m_backend.data._M_elems[0x13] = 0;
  tmp.val.m_backend.data._M_elems[0x14] = 0;
  tmp.val.m_backend.data._M_elems[0x15] = 0;
  tmp.val.m_backend.data._M_elems[0x16] = 0;
  tmp.val.m_backend.data._M_elems[0x17] = 0;
  tmp.val.m_backend.data._M_elems[0x18] = 0;
  tmp.val.m_backend.data._M_elems[0x19] = 0;
  tmp.val.m_backend.data._M_elems._104_5_ = 0;
  tmp.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  tmp.val.m_backend.exp = 0;
  tmp.val.m_backend.neg = false;
  local_808 = keys + (int)(iVar2 + uVar3) / 2;
  local_840 = keys;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::IdxElement::operator=(&pivotkey,local_808);
  local_820 = (long)(int)uVar3;
  local_828 = (long)iVar2;
  local_818 = uVar8;
  local_7f0 = (ulong)uVar3;
  do {
    uVar8 = (ulong)(int)uVar8;
    if (type) {
      pIVar10 = local_840 + uVar8;
      for (; (long)uVar8 < local_820; uVar8 = uVar8 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_b4,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_138,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_764,local_838,&local_b4,&local_138);
        local_844 = 0;
        tVar1 = boost::multiprecision::operator<(&local_764,&local_844);
        if (!tVar1) break;
        pIVar10 = pIVar10 + 1;
      }
      lVar6 = (long)(int)uVar3;
      pIVar10 = local_840 + lVar6;
      for (; local_828 < lVar6; lVar6 = lVar6 + -1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_1bc,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_240,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_764,local_838,&local_1bc,&local_240);
        local_844 = 0;
        tVar1 = boost::multiprecision::operator>=(&local_764,&local_844);
        if (!tVar1) break;
        pIVar10 = pIVar10 + -1;
      }
    }
    else {
      lVar6 = (long)(int)uVar3;
      pIVar10 = local_840 + uVar8;
      for (; (long)uVar8 < local_820; uVar8 = uVar8 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_2c4,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_348,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_764,local_838,&local_2c4,&local_348);
        local_844 = 0;
        tVar1 = boost::multiprecision::operator<=(&local_764,&local_844);
        if (!tVar1) break;
        pIVar10 = pIVar10 + 1;
      }
      pIVar10 = local_840 + lVar6;
      for (; local_828 < lVar6; lVar6 = lVar6 + -1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_3cc,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_450,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_764,local_838,&local_3cc,&local_450);
        local_844 = 0;
        tVar1 = boost::multiprecision::operator>(&local_764,&local_844);
        if (!tVar1) break;
        pIVar10 = pIVar10 + -1;
      }
    }
    pIVar10 = local_840;
    iVar4 = (int)uVar8;
    iVar2 = (int)lVar6;
    if (iVar2 <= iVar4) break;
    pIVar9 = local_840 + iVar4;
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(&tmp,pIVar9);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar9,pIVar10 + iVar2);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar10 + iVar2,&tmp);
    uVar8 = (ulong)(iVar4 + 1);
    uVar3 = iVar2 - 1;
  } while( true );
  if (type) {
    uVar8 = (ulong)iVar4;
    pIVar10 = local_840 + uVar8;
    for (; (long)uVar8 < local_820; uVar8 = uVar8 + 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_4d4,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_558,pIVar10);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_764,local_838,&local_4d4,&local_558);
      local_844 = 0;
      tVar1 = boost::multiprecision::operator>=(&local_764,&local_844);
      if (!tVar1) break;
      pIVar10 = pIVar10 + 1;
    }
    iVar4 = (int)local_818;
    if (iVar4 == (int)uVar8) {
      pIVar9 = local_840 + local_828;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar9);
      pIVar10 = local_808;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,local_808);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar10,&tmp);
      uVar8 = (ulong)(iVar4 + 1);
    }
  }
  else {
    uVar7 = (ulong)iVar2;
    pIVar10 = local_840 + uVar7;
    for (; local_828 < (long)uVar7; uVar7 = uVar7 - 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_5dc,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_660,pIVar10);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_764,local_838,&local_5dc,&local_660);
      local_844 = 0;
      tVar1 = boost::multiprecision::operator<=(&local_764,&local_844);
      if (!tVar1) break;
      pIVar10 = pIVar10 + -1;
    }
    if ((int)local_7f0 == (int)uVar7) {
      pIVar9 = local_840 + local_820;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar9);
      pIVar10 = local_808;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,local_808);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar10,&tmp);
      uVar7 = (ulong)((int)local_800 - 2);
    }
    iVar2 = (int)uVar7;
    iVar4 = (int)local_818;
  }
  pIVar10 = local_840;
  size_00 = (int)local_830;
  if (iVar2 - iVar4 < size_00 * 2) {
    iVar5 = (int)uVar8;
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (local_840,iVar2 + 1,local_838,iVar4,!type);
    if (size_00 <= iVar5 - iVar4) {
      return iVar5 + -1;
    }
    size_00 = local_80c - iVar5;
    start_00 = (int)local_7f8;
    iVar2 = (int)local_800;
    iVar4 = iVar5;
  }
  else {
    iVar2 = iVar2 + 1;
    start_00 = (int)local_7f8;
  }
  iVar2 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (pIVar10,local_838,start_00,iVar2,size_00,iVar4,end2,!type);
  return iVar2;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}